

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfDeepTiledInputFile.cpp
# Opt level: O1

void __thiscall
Imf_2_5::DeepTiledInputFile::readPixelSampleCounts
          (DeepTiledInputFile *this,int dx1,int dx2,int dy1,int dy2,int lx,int ly)

{
  pthread_mutex_t *__mutex;
  Data *pDVar1;
  IStream *pIVar2;
  Compressor *pCVar3;
  DeepTiledInputFile *pDVar4;
  int iVar5;
  bool bVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  undefined4 extraout_var;
  Int64 *pIVar10;
  long lVar11;
  ulong uVar12;
  InputExc *pIVar13;
  ostream *poVar14;
  ArgExc *pAVar15;
  uint uVar16;
  stringstream *psVar17;
  stringstream *psVar18;
  long lVar19;
  char *pcVar20;
  uint uVar21;
  long lVar22;
  int iVar23;
  long lVar24;
  long lVar25;
  long lVar26;
  bool bVar27;
  char local_249;
  undefined8 local_248;
  DeepTiledInputFile *local_240;
  Int64 tableSize;
  uint local_22c;
  ulong local_228;
  ulong local_220;
  ulong local_218;
  char *readPtr;
  Int64 unpackedDataSize;
  Box2i tileRange;
  Int64 dataSize;
  long local_1c8;
  long local_1c0;
  stringstream _iex_throw_s;
  ostream local_1a8 [376];
  
  __mutex = (pthread_mutex_t *)this->_data->_streamData;
  local_22c = dx2;
  iVar7 = pthread_mutex_lock(__mutex);
  local_240 = this;
  if (iVar7 != 0) {
    std::__throw_system_error(iVar7);
  }
  iVar7 = (*this->_data->_streamData->is->_vptr_IStream[5])();
  local_248 = CONCAT44(extraout_var,iVar7);
  if (((ly | lx) < 0) ||
     ((((pDVar1 = local_240->_data, lx != ly && ((pDVar1->tileDesc).mode == MIPMAP_LEVELS)) ||
       (pDVar1->numXLevels <= lx)) || (pDVar1->numYLevels <= ly)))) {
    iex_debugTrap();
    std::__cxx11::stringstream::stringstream((stringstream *)&_iex_throw_s);
    std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"Level coordinate (",0x12);
    poVar14 = (ostream *)std::ostream::operator<<((ostream *)local_1a8,lx);
    std::__ostream_insert<char,std::char_traits<char>>(poVar14,", ",2);
    poVar14 = (ostream *)std::ostream::operator<<((ostream *)poVar14,ly);
    std::__ostream_insert<char,std::char_traits<char>>(poVar14,") is invalid.",0xd);
    pAVar15 = (ArgExc *)__cxa_allocate_exception(0x48);
    Iex_2_5::ArgExc::ArgExc(pAVar15,(stringstream *)&_iex_throw_s);
    __cxa_throw(pAVar15,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
  }
  uVar8 = local_22c;
  if (dx1 < (int)local_22c) {
    uVar8 = dx1;
  }
  uVar9 = dy2;
  if (dy2 < dy1) {
    uVar9 = dy1;
  }
  if (dy1 < dy2) {
    dy2 = dy1;
  }
  uVar16 = uVar9 + 1;
  uVar21 = dy2 - 1;
  bVar27 = local_240->_data->lineOrder != DECREASING_Y;
  if (!bVar27) {
    dy2 = uVar9;
    uVar16 = uVar21;
  }
  if (dy2 != uVar16) {
    local_228 = (ulong)(uint)lx;
    if ((int)local_22c < dx1) {
      local_22c = dx1;
    }
    do {
      local_220 = (ulong)(uint)dy2;
      uVar9 = uVar8;
      do {
        pDVar4 = local_240;
        iVar7 = (int)local_220;
        iVar23 = (int)local_228;
        bVar6 = isValidTile(local_240,uVar9,iVar7,iVar23,ly);
        if (!bVar6) {
          iex_debugTrap();
          std::__cxx11::stringstream::stringstream((stringstream *)&_iex_throw_s);
          std::__ostream_insert<char,std::char_traits<char>>(local_1a8,"Tile (",6);
          poVar14 = (ostream *)std::ostream::operator<<((ostream *)local_1a8,uVar9);
          std::__ostream_insert<char,std::char_traits<char>>(poVar14,", ",2);
          poVar14 = (ostream *)std::ostream::operator<<((ostream *)poVar14,iVar7);
          std::__ostream_insert<char,std::char_traits<char>>(poVar14,", ",2);
          poVar14 = (ostream *)std::ostream::operator<<((ostream *)poVar14,iVar23);
          std::__ostream_insert<char,std::char_traits<char>>(poVar14,",",1);
          poVar14 = (ostream *)std::ostream::operator<<((ostream *)poVar14,ly);
          std::__ostream_insert<char,std::char_traits<char>>(poVar14,") is not a valid tile.",0x16);
          pAVar15 = (ArgExc *)__cxa_allocate_exception(0x48);
          Iex_2_5::ArgExc::ArgExc(pAVar15,(stringstream *)&_iex_throw_s);
          __cxa_throw(pAVar15,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
        }
        pDVar1 = pDVar4->_data;
        Imf_2_5::dataWindowForTile
                  ((Imf_2_5 *)&tileRange,&pDVar1->tileDesc,pDVar1->minX,pDVar1->maxX,pDVar1->minY,
                   pDVar1->maxY,uVar9,iVar7,iVar23,ly);
        pDVar1 = pDVar4->_data;
        local_1c0 = (long)pDVar1->sampleCountXTileCoords;
        lVar25 = (long)tileRange.min.x;
        local_1c8 = (long)pDVar1->sampleCountYTileCoords;
        lVar24 = (long)tileRange.min.y;
        pIVar2 = pDVar1->_streamData->is;
        local_218 = (ulong)uVar9;
        pIVar10 = TileOffsets::operator()(&pDVar1->tileOffsets,uVar9,iVar7,iVar23,ly);
        (*pIVar2->_vptr_IStream[6])(pIVar2,*pIVar10);
        if (((local_240->_data->version & 0x1000) != 0) &&
           (pIVar2 = local_240->_data->_streamData->is,
           (*pIVar2->_vptr_IStream[3])(pIVar2,&tableSize,4),
           (int)tableSize != local_240->_data->partNumber)) {
          pIVar13 = (InputExc *)__cxa_allocate_exception(0x48);
          Iex_2_5::InputExc::InputExc(pIVar13,"Unexpected part number.");
          __cxa_throw(pIVar13,&Iex_2_5::InputExc::typeinfo,Iex_2_5::InputExc::~InputExc);
        }
        pDVar4 = local_240;
        pIVar2 = local_240->_data->_streamData->is;
        (*pIVar2->_vptr_IStream[3])(pIVar2,&tableSize,4);
        iVar7 = (int)tableSize;
        pIVar2 = pDVar4->_data->_streamData->is;
        (*pIVar2->_vptr_IStream[3])(pIVar2,&tableSize,4);
        iVar23 = (int)tableSize;
        pIVar2 = pDVar4->_data->_streamData->is;
        (*pIVar2->_vptr_IStream[3])(pIVar2,&tableSize,4);
        iVar5 = (int)tableSize;
        pIVar2 = pDVar4->_data->_streamData->is;
        (*pIVar2->_vptr_IStream[3])(pIVar2,&tableSize,4);
        pDVar4 = local_240;
        if (iVar7 != (int)local_218) {
          pcVar20 = "Unexpected tile x coordinate.";
LAB_005a366e:
          pIVar13 = (InputExc *)__cxa_allocate_exception(0x48);
          Iex_2_5::InputExc::InputExc(pIVar13,pcVar20);
          __cxa_throw(pIVar13,&Iex_2_5::InputExc::typeinfo,Iex_2_5::InputExc::~InputExc);
        }
        if (iVar23 != (int)local_220) {
          pcVar20 = "Unexpected tile y coordinate.";
          goto LAB_005a366e;
        }
        if (iVar5 != (int)local_228) {
          pcVar20 = "Unexpected tile x level number coordinate.";
          goto LAB_005a366e;
        }
        if ((int)tableSize != ly) {
          pcVar20 = "Unexpected tile y level number coordinate.";
          goto LAB_005a366e;
        }
        Xdr::read<Imf_2_5::StreamIO,Imf_2_5::IStream>(local_240->_data->_streamData->is,&tableSize);
        Xdr::read<Imf_2_5::StreamIO,Imf_2_5::IStream>(pDVar4->_data->_streamData->is,&dataSize);
        Xdr::read<Imf_2_5::StreamIO,Imf_2_5::IStream>
                  (pDVar4->_data->_streamData->is,&unpackedDataSize);
        pDVar1 = pDVar4->_data;
        if (pDVar1->maxSampleCountTableSize < CONCAT44(tableSize._4_4_,(int)tableSize)) {
          iex_debugTrap();
          std::__cxx11::stringstream::stringstream((stringstream *)&_iex_throw_s);
          std::__ostream_insert<char,std::char_traits<char>>
                    (local_1a8,"Bad sampleCountTableDataSize read from tile ",0x2c);
          poVar14 = (ostream *)std::ostream::operator<<((ostream *)local_1a8,(int)local_218);
          readPtr = (char *)CONCAT71(readPtr._1_7_,0x2c);
          poVar14 = std::__ostream_insert<char,std::char_traits<char>>(poVar14,(char *)&readPtr,1);
          poVar14 = (ostream *)std::ostream::operator<<((ostream *)poVar14,(int)local_220);
          readPtr = (char *)CONCAT71(readPtr._1_7_,0x2c);
          poVar14 = std::__ostream_insert<char,std::char_traits<char>>(poVar14,(char *)&readPtr,1);
          poVar14 = (ostream *)std::ostream::operator<<((ostream *)poVar14,(int)local_228);
          readPtr = (char *)CONCAT71(readPtr._1_7_,0x2c);
          poVar14 = std::__ostream_insert<char,std::char_traits<char>>(poVar14,(char *)&readPtr,1);
          poVar14 = (ostream *)std::ostream::operator<<((ostream *)poVar14,ly);
          std::__ostream_insert<char,std::char_traits<char>>(poVar14,": expected ",0xb);
          poVar14 = std::ostream::_M_insert<unsigned_long>((ulong)poVar14);
          std::__ostream_insert<char,std::char_traits<char>>(poVar14," or less, got ",0xe);
          std::ostream::_M_insert<unsigned_long>((ulong)poVar14);
          pAVar15 = (ArgExc *)__cxa_allocate_exception(0x48);
          Iex_2_5::ArgExc::ArgExc(pAVar15,(stringstream *)&_iex_throw_s);
          __cxa_throw(pAVar15,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
        }
        if ((0x7fffffff < dataSize) ||
           ((unpackedDataSize | CONCAT44(tableSize._4_4_,(int)tableSize)) >> 0x1f != 0)) {
          iex_debugTrap();
          std::__cxx11::stringstream::stringstream((stringstream *)&_iex_throw_s);
          std::__ostream_insert<char,std::char_traits<char>>
                    (local_1a8,"This version of the library does not",0x24);
          std::__ostream_insert<char,std::char_traits<char>>
                    (local_1a8,"support the allocation of data with size  > ",0x2c);
          poVar14 = std::ostream::_M_insert<unsigned_long>((ulong)local_1a8);
          std::__ostream_insert<char,std::char_traits<char>>(poVar14," file table size    :",0x15);
          poVar14 = std::ostream::_M_insert<unsigned_long>((ulong)poVar14);
          std::__ostream_insert<char,std::char_traits<char>>(poVar14," file unpacked size :",0x15);
          poVar14 = std::ostream::_M_insert<unsigned_long>((ulong)poVar14);
          std::__ostream_insert<char,std::char_traits<char>>(poVar14," file packed size   :",0x15);
          poVar14 = std::ostream::_M_insert<unsigned_long>((ulong)poVar14);
          std::__ostream_insert<char,std::char_traits<char>>(poVar14,".\n",2);
          pAVar15 = (ArgExc *)__cxa_allocate_exception(0x48);
          Iex_2_5::ArgExc::ArgExc(pAVar15,(stringstream *)&_iex_throw_s);
          __cxa_throw(pAVar15,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
        }
        pIVar2 = pDVar1->_streamData->is;
        (*pIVar2->_vptr_IStream[3])(pIVar2,(pDVar1->sampleCountTableBuffer)._data);
        pDVar1 = local_240->_data;
        if (CONCAT44(tableSize._4_4_,(int)tableSize) < pDVar1->maxSampleCountTableSize) {
          pCVar3 = pDVar1->sampleCountTableComp;
          if (pCVar3 == (Compressor *)0x0) {
            iex_debugTrap();
            std::__cxx11::stringstream::stringstream((stringstream *)&_iex_throw_s);
            std::__ostream_insert<char,std::char_traits<char>>
                      (local_1a8,"Deep scanline data corrupt at tile ",0x23);
            poVar14 = (ostream *)std::ostream::operator<<((ostream *)local_1a8,(int)local_218);
            local_249 = ',';
            poVar14 = std::__ostream_insert<char,std::char_traits<char>>(poVar14,&local_249,1);
            poVar14 = (ostream *)std::ostream::operator<<((ostream *)poVar14,(int)local_220);
            local_249 = ',';
            poVar14 = std::__ostream_insert<char,std::char_traits<char>>(poVar14,&local_249,1);
            poVar14 = (ostream *)std::ostream::operator<<((ostream *)poVar14,(int)local_228);
            local_249 = ',';
            poVar14 = std::__ostream_insert<char,std::char_traits<char>>(poVar14,&local_249,1);
            poVar14 = (ostream *)std::ostream::operator<<((ostream *)poVar14,ly);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar14," (sampleCountTableDataSize error)",0x21);
            pAVar15 = (ArgExc *)__cxa_allocate_exception(0x48);
            Iex_2_5::ArgExc::ArgExc(pAVar15,(stringstream *)&_iex_throw_s);
            __cxa_throw(pAVar15,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
          }
          (*pCVar3->_vptr_Compressor[6])
                    (pCVar3,(pDVar1->sampleCountTableBuffer)._data,
                     CONCAT44(tableSize._4_4_,(int)tableSize),(ulong)(uint)tileRange.min.y);
        }
        else {
          readPtr = (pDVar1->sampleCountTableBuffer)._data;
        }
        if (tileRange.max.y < tileRange.min.y) {
          lVar26 = 0;
        }
        else {
          lVar26 = 0;
          lVar11 = (long)tileRange.min.y;
          psVar18 = (stringstream *)readPtr;
          do {
            if (tileRange.max.x < tileRange.min.x) {
              uVar12 = 0;
            }
            else {
              pDVar1 = local_240->_data;
              lVar19 = (long)tileRange.min.x;
              uVar9 = 0;
              do {
                lVar22 = 0;
                psVar17 = psVar18;
                do {
                  psVar18 = psVar17 + 1;
                  (&_iex_throw_s)[lVar22] = *psVar17;
                  lVar22 = lVar22 + 1;
                  psVar17 = psVar18;
                } while ((int)lVar22 != 4);
                uVar12 = (ulong)__iex_throw_s;
                readPtr = (char *)psVar18;
                if ((int)__iex_throw_s < (int)uVar9) {
                  iex_debugTrap();
                  std::__cxx11::stringstream::stringstream((stringstream *)&_iex_throw_s);
                  std::__ostream_insert<char,std::char_traits<char>>
                            (local_1a8,"Deep tile sampleCount data corrupt at tile ",0x2b);
                  poVar14 = (ostream *)std::ostream::operator<<((ostream *)local_1a8,(int)local_218)
                  ;
                  local_249 = ',';
                  poVar14 = std::__ostream_insert<char,std::char_traits<char>>(poVar14,&local_249,1)
                  ;
                  poVar14 = (ostream *)std::ostream::operator<<((ostream *)poVar14,(int)local_220);
                  local_249 = ',';
                  poVar14 = std::__ostream_insert<char,std::char_traits<char>>(poVar14,&local_249,1)
                  ;
                  poVar14 = (ostream *)std::ostream::operator<<((ostream *)poVar14,(int)local_228);
                  local_249 = ',';
                  poVar14 = std::__ostream_insert<char,std::char_traits<char>>(poVar14,&local_249,1)
                  ;
                  poVar14 = (ostream *)std::ostream::operator<<((ostream *)poVar14,ly);
                  std::__ostream_insert<char,std::char_traits<char>>
                            (poVar14," (negative sample count detected)",0x21);
                  pAVar15 = (ArgExc *)__cxa_allocate_exception(0x48);
                  Iex_2_5::ArgExc::ArgExc(pAVar15,(stringstream *)&_iex_throw_s);
                  __cxa_throw(pAVar15,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
                }
                *(uint *)(pDVar1->sampleCountSliceBase +
                         (long)(int)pDVar1->sampleCountXStride * (lVar19 - lVar25 * local_1c0) +
                         (long)(int)pDVar1->sampleCountYStride * (lVar11 - lVar24 * local_1c8)) =
                     __iex_throw_s - uVar9;
                bVar6 = lVar19 < tileRange.max.x;
                lVar19 = lVar19 + 1;
                uVar9 = __iex_throw_s;
              } while (bVar6);
            }
            lVar26 = lVar26 + uVar12;
            bVar6 = lVar11 < tileRange.max.y;
            lVar11 = lVar11 + 1;
          } while (bVar6);
        }
        uVar12 = local_240->_data->combinedSampleSize * lVar26;
        if (unpackedDataSize <= uVar12 && uVar12 - unpackedDataSize != 0) {
          iex_debugTrap();
          std::__cxx11::stringstream::stringstream((stringstream *)&_iex_throw_s);
          std::__ostream_insert<char,std::char_traits<char>>
                    (local_1a8,"Deep scanline sampleCount data corrupt at tile ",0x2f);
          poVar14 = (ostream *)std::ostream::operator<<((ostream *)local_1a8,(int)local_218);
          local_249 = ',';
          poVar14 = std::__ostream_insert<char,std::char_traits<char>>(poVar14,&local_249,1);
          poVar14 = (ostream *)std::ostream::operator<<((ostream *)poVar14,(int)local_220);
          local_249 = ',';
          poVar14 = std::__ostream_insert<char,std::char_traits<char>>(poVar14,&local_249,1);
          poVar14 = (ostream *)std::ostream::operator<<((ostream *)poVar14,(int)local_228);
          local_249 = ',';
          poVar14 = std::__ostream_insert<char,std::char_traits<char>>(poVar14,&local_249,1);
          poVar14 = (ostream *)std::ostream::operator<<((ostream *)poVar14,ly);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar14,": pixel data only contains ",0x1b);
          poVar14 = std::ostream::_M_insert<unsigned_long>((ulong)poVar14);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar14," bytes of data but table references at least ",0x2d);
          poVar14 = std::ostream::_M_insert<unsigned_long>((ulong)poVar14);
          std::__ostream_insert<char,std::char_traits<char>>(poVar14," bytes of sample data",0x15);
          pAVar15 = (ArgExc *)__cxa_allocate_exception(0x48);
          Iex_2_5::ArgExc::ArgExc(pAVar15,(stringstream *)&_iex_throw_s);
          __cxa_throw(pAVar15,&Iex_2_5::ArgExc::typeinfo,Iex_2_5::ArgExc::~ArgExc);
        }
        uVar9 = (uint)local_218 + 1;
      } while ((uint)local_218 != local_22c);
      dy2 = (int)local_220 + (uint)bVar27 * 2 + -1;
    } while (dy2 != uVar16);
  }
  pIVar2 = local_240->_data->_streamData->is;
  (*pIVar2->_vptr_IStream[6])(pIVar2,local_248);
  pthread_mutex_unlock(__mutex);
  return;
}

Assistant:

void
DeepTiledInputFile::readPixelSampleCounts (int dx1, int dx2,
                                           int dy1, int dy2,
                                           int lx,  int ly)
{
    Int64 savedFilePos = 0;

    try
    {
        Lock lock (*_data->_streamData);

        savedFilePos = _data->_streamData->is->tellg();

        
        if (!isValidLevel (lx, ly))
        {
            THROW (IEX_NAMESPACE::ArgExc,
                   "Level coordinate "
                   "(" << lx << ", " << ly << ") "
                   "is invalid.");
        }
        
        if (dx1 > dx2)
            std::swap (dx1, dx2);

        if (dy1 > dy2)
            std::swap (dy1, dy2);

        int dyStart = dy1;
        int dyStop  = dy2 + 1;
        int dY      = 1;

        if (_data->lineOrder == DECREASING_Y)
        {
            dyStart = dy2;
            dyStop  = dy1 - 1;
            dY      = -1;
        }

        // (TODO) Check if we have read the sample counts for those tiles,
        // if we have, no need to read again.
        for (int dy = dyStart; dy != dyStop; dy += dY)
        {
            for (int dx = dx1; dx <= dx2; dx++)
            {
                
                if (!isValidTile (dx, dy, lx, ly))
                {
                    THROW (IEX_NAMESPACE::ArgExc,
                           "Tile (" << dx << ", " << dy << ", " <<
                           lx << "," << ly << ") is not a valid tile.");
                }
                
                Box2i tileRange = OPENEXR_IMF_INTERNAL_NAMESPACE::dataWindowForTile (
                        _data->tileDesc,
                        _data->minX, _data->maxX,
                        _data->minY, _data->maxY,
                        dx, dy, lx, ly);

                int xOffset = _data->sampleCountXTileCoords * tileRange.min.x;
                int yOffset = _data->sampleCountYTileCoords * tileRange.min.y;

                //
                // Skip and check the tile coordinates.
                //

                _data->_streamData->is->seekg(_data->tileOffsets(dx, dy, lx, ly));

                if (isMultiPart(_data->version))
                {
                    int partNumber;
                    Xdr::read <StreamIO> (*_data->_streamData->is, partNumber);

                    if (partNumber != _data->partNumber)
                        throw IEX_NAMESPACE::InputExc ("Unexpected part number.");
                }

                int xInFile, yInFile, lxInFile, lyInFile;
                Xdr::read <StreamIO> (*_data->_streamData->is, xInFile);
                Xdr::read <StreamIO> (*_data->_streamData->is, yInFile);
                Xdr::read <StreamIO> (*_data->_streamData->is, lxInFile);
                Xdr::read <StreamIO> (*_data->_streamData->is, lyInFile);

                if (xInFile != dx)
                    throw IEX_NAMESPACE::InputExc ("Unexpected tile x coordinate.");

                if (yInFile != dy)
                    throw IEX_NAMESPACE::InputExc ("Unexpected tile y coordinate.");

                if (lxInFile != lx)
                    throw IEX_NAMESPACE::InputExc ("Unexpected tile x level number coordinate.");

                if (lyInFile != ly)
                    throw IEX_NAMESPACE::InputExc ("Unexpected tile y level number coordinate.");

                Int64 tableSize, dataSize, unpackedDataSize;
                Xdr::read <StreamIO> (*_data->_streamData->is, tableSize);
                Xdr::read <StreamIO> (*_data->_streamData->is, dataSize);
                Xdr::read <StreamIO> (*_data->_streamData->is, unpackedDataSize);

                
                if(tableSize>_data->maxSampleCountTableSize)
                {
                    THROW (IEX_NAMESPACE::ArgExc, "Bad sampleCountTableDataSize read from tile "<< dx << ',' << dy << ',' << lx << ',' << ly << ": expected " << _data->maxSampleCountTableSize << " or less, got "<< tableSize);
                }
                    
                
                //
                // We make a check on the data size requirements here.
                // Whilst we wish to store 64bit sizes on disk, not all the compressors
                // have been made to work with such data sizes and are still limited to
                // using signed 32 bit (int) for the data size. As such, this version
                // insists that we validate that the data size does not exceed the data
                // type max limit.
                // @TODO refactor the compressor code to ensure full 64-bit support.
                //

                Int64 compressorMaxDataSize = static_cast<Int64>(std::numeric_limits<int>::max());
                if (dataSize         > compressorMaxDataSize ||
                    unpackedDataSize > compressorMaxDataSize ||
                    tableSize        > compressorMaxDataSize)
                {
                    THROW (IEX_NAMESPACE::ArgExc, "This version of the library does not"
                          << "support the allocation of data with size  > "
                          << compressorMaxDataSize
                          << " file table size    :" << tableSize
                          << " file unpacked size :" << unpackedDataSize
                          << " file packed size   :" << dataSize << ".\n");
                }

                //
                // Read and uncompress the pixel sample count table.
                //

                _data->_streamData->is->read(_data->sampleCountTableBuffer, tableSize);

                const char* readPtr;

                if (tableSize < _data->maxSampleCountTableSize)
                {
                    if(!_data->sampleCountTableComp)
                    {
                        THROW(IEX_NAMESPACE::ArgExc,"Deep scanline data corrupt at tile " << dx << ',' << dy << ',' << lx << ',' <<  ly << " (sampleCountTableDataSize error)");
                    }
                    _data->sampleCountTableComp->uncompress(_data->sampleCountTableBuffer,
                                                            tableSize,
                                                            tileRange.min.y,
                                                            readPtr);
                }
                else
                    readPtr = _data->sampleCountTableBuffer;

                size_t cumulative_total_samples =0;
                int lastAccumulatedCount;
                for (int j = tileRange.min.y; j <= tileRange.max.y; j++)
                {
                    lastAccumulatedCount = 0;
                    for (int i = tileRange.min.x; i <= tileRange.max.x; i++)
                    {
                        int accumulatedCount;
                        Xdr::read <CharPtrIO> (readPtr, accumulatedCount);
                        
                        if (accumulatedCount < lastAccumulatedCount)
                        {
                            THROW(IEX_NAMESPACE::ArgExc,"Deep tile sampleCount data corrupt at tile " 
                                  << dx << ',' << dy << ',' << lx << ',' <<  ly << " (negative sample count detected)");
                        }

                        int count = accumulatedCount - lastAccumulatedCount;
                        lastAccumulatedCount = accumulatedCount;
                        
                        _data->getSampleCount(i - xOffset, j - yOffset) =count;
                    }
                    cumulative_total_samples += lastAccumulatedCount;
                }
                
                if(cumulative_total_samples * _data->combinedSampleSize > unpackedDataSize)
                {
                    THROW(IEX_NAMESPACE::ArgExc,"Deep scanline sampleCount data corrupt at tile " 
                                                << dx << ',' << dy << ',' << lx << ',' <<  ly 
                                                << ": pixel data only contains " << unpackedDataSize 
                                                << " bytes of data but table references at least " 
                                                << cumulative_total_samples*_data->combinedSampleSize << " bytes of sample data" );            
                }
                    
            }
        }

        _data->_streamData->is->seekg(savedFilePos);
    }
    catch (IEX_NAMESPACE::BaseExc &e)
    {
        REPLACE_EXC (e, "Error reading sample count data from image "
                     "file \"" << fileName() << "\". " << e.what());

         _data->_streamData->is->seekg(savedFilePos);

        throw;
    }
}